

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

size_t __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::send_to<asio::mutable_buffers_1>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          mutable_buffers_1 *buffers,endpoint_type *destination,message_flags flags,error_code *ec)

{
  size_t sVar1;
  
  sVar1 = 0x1c;
  if ((destination->impl_).data_.base.sa_family == 2) {
    sVar1 = 0x10;
  }
  sVar1 = socket_ops::sync_sendto1
                    ((impl->super_base_implementation_type).socket_,
                     (impl->super_base_implementation_type).state_,
                     (buffers->super_mutable_buffer).data_,(buffers->super_mutable_buffer).size_,
                     flags,destination,sVar1,ec);
  return sVar1;
}

Assistant:

size_t send_to(implementation_type& impl, const ConstBufferSequence& buffers,
      const endpoint_type& destination, socket_base::message_flags flags,
      asio::error_code& ec)
  {
    typedef buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs_type;

    size_t n;
    if (bufs_type::is_single_buffer)
    {
      n = socket_ops::sync_sendto1(impl.socket_, impl.state_,
          bufs_type::first(buffers).data(),
          bufs_type::first(buffers).size(), flags,
          destination.data(), destination.size(), ec);
    }
    else
    {
      bufs_type bufs(buffers);
      n = socket_ops::sync_sendto(impl.socket_, impl.state_,
          bufs.buffers(), bufs.count(), flags,
          destination.data(), destination.size(), ec);
    }

    ASIO_ERROR_LOCATION(ec);
    return n;
  }